

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_pairing.h
# Opt level: O3

void Gudhi::persistence_matrix::swap
               (Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                *pairing1,
               Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
               *pairing2)

{
  Pos_index PVar1;
  size_t sVar2;
  
  std::__detail::_List_node_base::swap((_List_node_base *)pairing1,(_List_node_base *)pairing2);
  sVar2 = (pairing2->barcode_).
          super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
          ._M_impl._M_node._M_size;
  (pairing2->barcode_).
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size =
       (pairing1->barcode_).
       super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ._M_impl._M_node._M_size;
  (pairing1->barcode_).
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = sVar2;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&(pairing1->indexToBar_)._M_h,&(pairing2->indexToBar_)._M_h);
  PVar1 = pairing1->nextPosition_;
  pairing1->nextPosition_ = pairing2->nextPosition_;
  pairing2->nextPosition_ = PVar1;
  return;
}

Assistant:

void swap(Chain_pairing& pairing1, Chain_pairing& pairing2) {
    pairing1.barcode_.swap(pairing2.barcode_);
    pairing1.indexToBar_.swap(pairing2.indexToBar_);
    std::swap(pairing1.nextPosition_, pairing2.nextPosition_);
  }